

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::Table::Init
          (Table *this,Store *store,u32 dst_offset,ElemSegment *src,u32 src_offset,u32 size)

{
  Enum EVar1;
  Enum EVar2;
  pointer pRVar3;
  pointer pRVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  
  pRVar3 = (this->elements_).
           super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = (long)(this->elements_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pRVar3 >> 3;
  uVar5 = (ulong)size;
  if (uVar6 - uVar5 < (ulong)dst_offset || uVar6 < uVar5) {
    return (Result)Error;
  }
  pRVar4 = (src->elements_).
           super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = (uint)((ulong)((long)(src->elements_).
                               super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar4) >> 3);
  if (src_offset <= uVar7 - size && size <= uVar7) {
    EVar1 = *(Enum *)&(this->type_).super_ExternType.field_0xc;
    EVar2 = (src->desc_->type).enum_;
    if (EVar1 != EVar2) {
      switch(EVar1) {
      case 0xffffffe9:
      case Exnref|Hostref:
      case 0xffffffeb:
      case Exnref|I8U:
      case 0xffffffed:
        return (Result)Error;
      case Anyref:
        break;
      default:
        if (EVar1 != Hostref) {
          return (Result)Error;
        }
      case Exnref:
      case Nullref:
      case Funcref:
        if (EVar2 != Nullref) {
          return (Result)Error;
        }
      }
    }
    if (size != 0) {
      memmove(pRVar3 + dst_offset,pRVar4 + src_offset,uVar5 << 3);
    }
    return (Result)Ok;
  }
  return (Result)Error;
}

Assistant:

Result Table::Init(Store& store,
                   u32 dst_offset,
                   const ElemSegment& src,
                   u32 src_offset,
                   u32 size) {
  if (IsValidRange(dst_offset, size) && src.IsValidRange(src_offset, size) &&
      TypesMatch(type_.element, src.desc().type)) {
    std::copy(src.elements().begin() + src_offset,
              src.elements().begin() + src_offset + size,
              elements_.begin() + dst_offset);
    return Result::Ok;
  }
  return Result::Error;
}